

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cproxy.c
# Opt level: O0

void http_digest_response
               (BinarySink *bs,ptrlen username,ptrlen password,ptrlen realm,ptrlen method,ptrlen uri
               ,ptrlen qop,ptrlen nonce,ptrlen opaque,uint32_t nonce_count,HttpDigestHash hash,
               _Bool hash_username)

{
  ssh_hashalg *alg_00;
  BinarySink *pBVar1;
  ssh_hash *psVar2;
  ptrlen pVar3;
  ssh_hash *h_1;
  ssh_hash *h;
  char local_218 [4];
  uint i;
  char client_nonce_base64 [44];
  uchar client_nonce_raw [33];
  undefined1 local_1bc [4];
  size_t sStack_1b8;
  uchar ncbuf [4];
  size_t hashlen;
  ssh_hashalg *alg;
  uchar rsphash [114];
  uchar local_128 [8];
  uchar a2hash [114];
  uchar local_a8 [8];
  uchar a1hash [114];
  _Bool hash_username_local;
  uint32_t nonce_count_local;
  BinarySink *bs_local;
  ptrlen password_local;
  ptrlen username_local;
  
  a1hash[0x6b] = hash_username;
  alg_00 = httphashalgs[hash];
  sStack_1b8 = httphashlengths[hash];
  a1hash._108_4_ = nonce_count;
  unique0x10000b42 = bs;
  PUT_32BIT_MSB_FIRST(local_1bc,nonce_count);
  random_read(client_nonce_base64 + 0x28,0x21);
  for (h._4_4_ = 0; h._4_4_ < 0xb; h._4_4_ = h._4_4_ + 1) {
    base64_encode_atom((uchar *)(client_nonce_base64 + (ulong)(h._4_4_ * 3) + 0x28),3,
                       local_218 + (h._4_4_ << 2));
  }
  psVar2 = ssh_hash_new(alg_00);
  BinarySink_put_datapl(psVar2->binarysink_,username);
  BinarySink_put_byte(psVar2->binarysink_,':');
  BinarySink_put_datapl(psVar2->binarysink_,realm);
  BinarySink_put_byte(psVar2->binarysink_,':');
  BinarySink_put_datapl(psVar2->binarysink_,password);
  ssh_hash_digest_nondestructive(psVar2,local_a8);
  ssh_hash_reset(psVar2);
  BinarySink_put_datapl(psVar2->binarysink_,method);
  BinarySink_put_byte(psVar2->binarysink_,':');
  BinarySink_put_datapl(psVar2->binarysink_,uri);
  ssh_hash_digest_nondestructive(psVar2,local_128);
  ssh_hash_reset(psVar2);
  BinarySink_put_hex_data(psVar2->binarysink_,local_a8,sStack_1b8);
  BinarySink_put_byte(psVar2->binarysink_,':');
  BinarySink_put_datapl(psVar2->binarysink_,nonce);
  BinarySink_put_byte(psVar2->binarysink_,':');
  BinarySink_put_hex_data(psVar2->binarysink_,local_1bc,4);
  BinarySink_put_byte(psVar2->binarysink_,':');
  BinarySink_put_data(psVar2->binarysink_,local_218,0x2c);
  BinarySink_put_byte(psVar2->binarysink_,':');
  BinarySink_put_datapl(psVar2->binarysink_,qop);
  BinarySink_put_byte(psVar2->binarysink_,':');
  BinarySink_put_hex_data(psVar2->binarysink_,local_128,sStack_1b8);
  ssh_hash_final(psVar2,(uchar *)&alg);
  pBVar1 = stack0xffffffffffffffd0->binarysink_;
  pVar3 = make_ptrlen("username=\"",10);
  BinarySink_put_datapl(pBVar1,pVar3);
  if ((a1hash[0x6b] & 1) == 0) {
    BinarySink_put_datapl(stack0xffffffffffffffd0->binarysink_,username);
  }
  else {
    psVar2 = ssh_hash_new(alg_00);
    BinarySink_put_datapl(psVar2->binarysink_,username);
    BinarySink_put_byte(psVar2->binarysink_,':');
    BinarySink_put_datapl(psVar2->binarysink_,realm);
    ssh_hash_final(psVar2,local_a8);
    BinarySink_put_hex_data(stack0xffffffffffffffd0->binarysink_,local_a8,sStack_1b8);
  }
  pBVar1 = stack0xffffffffffffffd0->binarysink_;
  pVar3 = make_ptrlen("\", realm=\"",10);
  BinarySink_put_datapl(pBVar1,pVar3);
  BinarySink_put_datapl(stack0xffffffffffffffd0->binarysink_,realm);
  pBVar1 = stack0xffffffffffffffd0->binarysink_;
  pVar3 = make_ptrlen("\", uri=\"",8);
  BinarySink_put_datapl(pBVar1,pVar3);
  BinarySink_put_datapl(stack0xffffffffffffffd0->binarysink_,uri);
  pBVar1 = stack0xffffffffffffffd0->binarysink_;
  pVar3 = make_ptrlen("\", algorithm=",0xd);
  BinarySink_put_datapl(pBVar1,pVar3);
  pBVar1 = stack0xffffffffffffffd0->binarysink_;
  pVar3 = ptrlen_from_asciz(httphashnames[hash]);
  BinarySink_put_datapl(pBVar1,pVar3);
  pBVar1 = stack0xffffffffffffffd0->binarysink_;
  pVar3 = make_ptrlen(", nonce=\"",9);
  BinarySink_put_datapl(pBVar1,pVar3);
  BinarySink_put_datapl(stack0xffffffffffffffd0->binarysink_,nonce);
  pBVar1 = stack0xffffffffffffffd0->binarysink_;
  pVar3 = make_ptrlen("\", nc=",6);
  BinarySink_put_datapl(pBVar1,pVar3);
  BinarySink_put_hex_data(stack0xffffffffffffffd0->binarysink_,local_1bc,4);
  pBVar1 = stack0xffffffffffffffd0->binarysink_;
  pVar3 = make_ptrlen(", cnonce=\"",10);
  BinarySink_put_datapl(pBVar1,pVar3);
  BinarySink_put_data(stack0xffffffffffffffd0->binarysink_,local_218,0x2c);
  pBVar1 = stack0xffffffffffffffd0->binarysink_;
  pVar3 = make_ptrlen("\", qop=",7);
  BinarySink_put_datapl(pBVar1,pVar3);
  BinarySink_put_datapl(stack0xffffffffffffffd0->binarysink_,qop);
  pBVar1 = stack0xffffffffffffffd0->binarysink_;
  pVar3 = make_ptrlen(", response=\"",0xc);
  BinarySink_put_datapl(pBVar1,pVar3);
  BinarySink_put_hex_data(stack0xffffffffffffffd0->binarysink_,&alg,sStack_1b8);
  pBVar1 = stack0xffffffffffffffd0->binarysink_;
  pVar3 = make_ptrlen("\"",1);
  BinarySink_put_datapl(pBVar1,pVar3);
  if (opaque.ptr != (void *)0x0) {
    pBVar1 = stack0xffffffffffffffd0->binarysink_;
    pVar3 = make_ptrlen(", opaque=\"",10);
    BinarySink_put_datapl(pBVar1,pVar3);
    BinarySink_put_datapl(stack0xffffffffffffffd0->binarysink_,opaque);
    pBVar1 = stack0xffffffffffffffd0->binarysink_;
    pVar3 = make_ptrlen("\"",1);
    BinarySink_put_datapl(pBVar1,pVar3);
  }
  if ((a1hash[0x6b] & 1) != 0) {
    pBVar1 = stack0xffffffffffffffd0->binarysink_;
    pVar3 = make_ptrlen(", userhash=true",0xf);
    BinarySink_put_datapl(pBVar1,pVar3);
  }
  smemclr(local_a8,0x72);
  smemclr(local_128,0x72);
  smemclr(&alg,0x72);
  smemclr(client_nonce_base64 + 0x28,0x21);
  smemclr(local_218,0x2c);
  return;
}

Assistant:

void http_digest_response(BinarySink *bs, ptrlen username, ptrlen password,
                          ptrlen realm, ptrlen method, ptrlen uri, ptrlen qop,
                          ptrlen nonce, ptrlen opaque, uint32_t nonce_count,
                          HttpDigestHash hash, bool hash_username)
{
    unsigned char a1hash[MAX_HASH_LEN];
    unsigned char a2hash[MAX_HASH_LEN];
    unsigned char rsphash[MAX_HASH_LEN];
    const ssh_hashalg *alg = httphashalgs[hash];
    size_t hashlen = httphashlengths[hash];

    unsigned char ncbuf[4];
    PUT_32BIT_MSB_FIRST(ncbuf, nonce_count);

    unsigned char client_nonce_raw[33];
    random_read(client_nonce_raw, lenof(client_nonce_raw));
    char client_nonce_base64[lenof(client_nonce_raw) / 3 * 4];
    for (unsigned i = 0; i < lenof(client_nonce_raw)/3; i++)
        base64_encode_atom(client_nonce_raw + 3*i, 3,
                           client_nonce_base64 + 4*i);

    /*
     * RFC 7616 section 3.4.2: the hash "A1" is a hash of
     * username:realm:password (in the absence of hash names like
     * "MD5-sess" which as far as I know don't sensibly apply to
     * proxies and HTTP CONNECT).
     */
    ssh_hash *h = ssh_hash_new(alg);
    put_datapl(h, username);
    put_byte(h, ':');
    put_datapl(h, realm);
    put_byte(h, ':');
    put_datapl(h, password);
    ssh_hash_digest_nondestructive(h, a1hash);

    /*
     * RFC 7616 section 3.4.3: the hash "A2" is a hash of method:uri
     * (in the absence of more interesting quality-of-protection
     * schemes than plain "auth" - e.g. "auth-int" hashes the entire
     * document as well - which again I don't think make sense in the
     * context of proxies and CONNECT).
     */
    ssh_hash_reset(h);
    put_datapl(h, method);
    put_byte(h, ':');
    put_datapl(h, uri);
    ssh_hash_digest_nondestructive(h, a2hash);

    /*
     * RFC 7616 section 3.4.1: the overall output hash in the
     * "response" parameter of the authorization header is a hash of
     * A1:nonce:nonce-count:client-nonce:qop:A2, where A1 and A2 are
     * the hashes computed above.
     */
    ssh_hash_reset(h);
    put_hex_data(h, a1hash, hashlen);
    put_byte(h, ':');
    put_datapl(h, nonce);
    put_byte(h, ':');
    put_hex_data(h, ncbuf, 4);
    put_byte(h, ':');
    put_data(h, client_nonce_base64, lenof(client_nonce_base64));
    put_byte(h, ':');
    put_datapl(h, qop);
    put_byte(h, ':');
    put_hex_data(h, a2hash, hashlen);
    ssh_hash_final(h, rsphash);

    /*
     * Now construct the output header (everything after the initial
     * "Proxy-Authorization: Digest ") and write it to the provided
     * BinarySink.
     */
    put_datalit(bs, "username=\"");
    if (hash_username) {
        /*
         * RFC 7616 section 3.4.4: if we're hashing the username, we
         * actually hash username:realm (like a truncated version of
         * A1 above).
         */
        ssh_hash *h = ssh_hash_new(alg);
        put_datapl(h, username);
        put_byte(h, ':');
        put_datapl(h, realm);
        ssh_hash_final(h, a1hash);
        put_hex_data(bs, a1hash, hashlen);
    } else {
        put_datapl(bs, username);
    }
    put_datalit(bs, "\", realm=\"");
    put_datapl(bs, realm);
    put_datalit(bs, "\", uri=\"");
    put_datapl(bs, uri);
    put_datalit(bs, "\", algorithm=");
    put_dataz(bs, httphashnames[hash]);
    put_datalit(bs, ", nonce=\"");
    put_datapl(bs, nonce);
    put_datalit(bs, "\", nc=");
    put_hex_data(bs, ncbuf, 4);
    put_datalit(bs, ", cnonce=\"");
    put_data(bs, client_nonce_base64, lenof(client_nonce_base64));
    put_datalit(bs, "\", qop=");
    put_datapl(bs, qop);
    put_datalit(bs, ", response=\"");
    put_hex_data(bs, rsphash, hashlen);
    put_datalit(bs, "\"");

    if (opaque.ptr) {
        put_datalit(bs, ", opaque=\"");
        put_datapl(bs, opaque);
        put_datalit(bs, "\"");
    }

    if (hash_username) {
        put_datalit(bs, ", userhash=true");
    }

    smemclr(a1hash, lenof(a1hash));
    smemclr(a2hash, lenof(a2hash));
    smemclr(rsphash, lenof(rsphash));
    smemclr(client_nonce_raw, lenof(client_nonce_raw));
    smemclr(client_nonce_base64, lenof(client_nonce_base64));
}